

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O2

void USPE_seasonal(double *inp,int N,int s,int p,int q,double *phi,double *theta)

{
  size_t __size;
  int iVar1;
  uint N_00;
  uint uVar2;
  double *acov;
  void *__ptr;
  double *A;
  double *b;
  int *ipiv;
  double *__ptr_00;
  undefined8 *__ptr_01;
  double *array;
  double *__ptr_02;
  double *x;
  double *A_00;
  int *ipiv_00;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  int iVar12;
  double *pdVar13;
  ulong uVar14;
  long lVar15;
  double dVar16;
  
  uVar9 = (ulong)(uint)q;
  iVar1 = (q + p + 1) * s;
  acov = (double *)malloc((long)iVar1 * 8);
  __ptr = malloc((long)(q + p) * 8 + 8);
  lVar11 = (long)p;
  A = (double *)malloc(lVar11 * 8 * lVar11);
  b = (double *)malloc(lVar11 * 8);
  ipiv = (int *)malloc(lVar11 * 4);
  N_00 = q + 1;
  lVar15 = (long)q;
  __size = lVar15 * 8 + 8;
  __ptr_00 = (double *)malloc(__size);
  __ptr_01 = (undefined8 *)malloc((long)(int)(p + 1U) << 3);
  array = (double *)malloc(__size);
  __ptr_02 = (double *)malloc(__size);
  x = (double *)malloc(__size);
  A_00 = (double *)malloc((lVar15 + 1) * __size);
  ipiv_00 = (int *)malloc(lVar15 * 4 + 4);
  autocovar(inp,N,acov,iVar1);
  pdVar5 = acov;
  for (lVar6 = 0; lVar6 <= q + p; lVar6 = lVar6 + 1) {
    *(double *)((long)__ptr + lVar6 * 8) = *pdVar5;
    pdVar5 = pdVar5 + s;
  }
  *__ptr_01 = 0xbff0000000000000;
  uVar3 = 0;
  uVar8 = 0;
  if (0 < p) {
    uVar8 = (ulong)(uint)p;
  }
  for (; uVar8 != uVar3; uVar3 = uVar3 + 1) {
    phi[uVar3] = 0.0;
  }
  uVar4 = 0;
  uVar3 = 0;
  if (0 < q) {
    uVar3 = uVar9;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    theta[uVar4] = 0.0;
  }
  uVar4 = (ulong)(p + 1U);
  if (0 < p) {
    pdVar5 = A;
    for (uVar7 = 1; uVar7 != uVar4; uVar7 = uVar7 + 1) {
      iVar1 = (int)uVar9;
      for (lVar6 = 0; uVar4 - 1 != lVar6; lVar6 = lVar6 + 1) {
        iVar12 = (int)uVar9;
        uVar14 = (ulong)(uint)-iVar12;
        if (0 < iVar12) {
          uVar14 = uVar9;
        }
        pdVar5[lVar6] = *(double *)((long)__ptr + uVar14 * 8);
        uVar9 = (ulong)(iVar12 - 1);
      }
      pdVar5 = pdVar5 + lVar11;
      uVar9 = (ulong)(iVar1 + 1);
    }
    for (uVar9 = 0; (uint)p != uVar9; uVar9 = uVar9 + 1) {
      b[uVar9] = *(double *)((long)__ptr + uVar9 * 8 + lVar15 * 8 + 8);
    }
    ludecomp(A,p,ipiv);
    linsolve(A,p,b,ipiv,phi);
  }
  for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    __ptr_01[uVar9 + 1] = phi[uVar9];
  }
  if (p == 0) {
    for (lVar6 = 0; lVar6 <= lVar15; lVar6 = lVar6 + 1) {
      __ptr_00[lVar6] = *(double *)((long)__ptr + lVar6 * 8);
    }
  }
  else {
    for (uVar9 = 0; (long)uVar9 <= lVar15; uVar9 = uVar9 + 1) {
      dVar16 = 0.0;
      uVar8 = uVar9 & 0xffffffff;
      for (lVar6 = 0; lVar6 <= lVar11; lVar6 = lVar6 + 1) {
        iVar1 = (int)uVar8;
        for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
          iVar12 = (int)uVar8;
          uVar14 = (ulong)(uint)-iVar12;
          if (0 < iVar12) {
            uVar14 = uVar8;
          }
          dVar16 = dVar16 + (double)__ptr_01[lVar6] * (double)__ptr_01[uVar7] *
                            *(double *)((long)__ptr + uVar14 * 8);
          uVar8 = (ulong)(iVar12 - 1);
        }
        uVar8 = (ulong)(iVar1 + 1);
      }
      __ptr_00[uVar9] = dVar16;
    }
  }
  for (lVar6 = 0; lVar6 <= lVar15; lVar6 = lVar6 + 1) {
    __ptr_02[lVar6] = 0.0;
    array[lVar6] = 0.0;
  }
  dVar16 = *__ptr_00;
  if (dVar16 < 0.0) {
    dVar16 = sqrt(dVar16);
  }
  else {
    dVar16 = SQRT(dVar16);
  }
  *__ptr_02 = dVar16;
  pdVar5 = __ptr_02;
  for (lVar6 = 0; lVar6 <= lVar15; lVar6 = lVar6 + 1) {
    for (lVar11 = 0; lVar11 <= lVar15 - lVar6; lVar11 = lVar11 + 1) {
      array[lVar6] = __ptr_02[lVar11] * pdVar5[lVar11] + array[lVar6];
    }
    array[lVar6] = array[lVar6] - __ptr_00[lVar6];
    pdVar5 = pdVar5 + 1;
  }
  for (uVar2 = 0; (dVar16 = array_max_abs(array,N_00), 0.0001 < dVar16 && (uVar2 < 200));
      uVar2 = uVar2 + 1) {
    lVar6 = 0;
    pdVar5 = __ptr_02;
    pdVar10 = __ptr_02;
    pdVar13 = A_00;
    for (lVar11 = 0; lVar11 <= lVar15; lVar11 = lVar11 + 1) {
      for (uVar9 = 0; N_00 != uVar9; uVar9 = uVar9 + 1) {
        dVar16 = 0.0;
        if ((long)(lVar11 + uVar9) <= lVar15) {
          dVar16 = pdVar10[uVar9] + 0.0;
        }
        if (-1 < (long)(lVar6 + uVar9)) {
          dVar16 = dVar16 + pdVar5[uVar9];
        }
        pdVar13[uVar9] = dVar16;
      }
      pdVar13 = pdVar13 + lVar15 + 1;
      pdVar10 = pdVar10 + 1;
      lVar6 = lVar6 + -1;
      pdVar5 = pdVar5 + -1;
    }
    ludecomp(A_00,N_00,ipiv_00);
    linsolve(A_00,N_00,array,ipiv_00,x);
    for (lVar6 = 0; lVar6 <= lVar15; lVar6 = lVar6 + 1) {
      __ptr_02[lVar6] = __ptr_02[lVar6] - x[lVar6];
      array[lVar6] = 0.0;
    }
    pdVar5 = __ptr_02;
    for (lVar6 = 0; lVar6 <= lVar15; lVar6 = lVar6 + 1) {
      dVar16 = array[lVar6];
      for (lVar11 = 0; lVar11 <= lVar15 - lVar6; lVar11 = lVar11 + 1) {
        dVar16 = dVar16 + __ptr_02[lVar11] * pdVar5[lVar11];
        array[lVar6] = dVar16;
      }
      array[lVar6] = dVar16 - __ptr_00[lVar6];
      pdVar5 = pdVar5 + 1;
    }
  }
  for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
    theta[uVar9] = -__ptr_02[uVar9 + 1] / *__ptr_02;
  }
  free(__ptr);
  free(acov);
  free(A);
  free(b);
  free(ipiv);
  free(__ptr_00);
  free(__ptr_01);
  free(array);
  free(__ptr_02);
  free(A_00);
  free(ipiv_00);
  free(x);
  return;
}

Assistant:

void USPE_seasonal(double *inp,int N,int s,int p, int q, double *phi,double *theta) {
	int K,i,j,l,t,temp,it1;
	double tempd,epsilon;
	double *b,*c,*A,*c2,*x,*f,*tau,*T,*h,*cv;
	int *ipiv,*ipiv2;

	K = (p + q + 1) * s;

	cv = (double *) malloc(sizeof(double) * K);
	c = (double *) malloc(sizeof(double) * (p+q+1));
	A = (double *) malloc(sizeof(double) * p * p);
	b = (double *) malloc(sizeof(double) * p);
	ipiv = (int *) malloc(sizeof(int) * p);
	c2 = (double *) malloc(sizeof(double) * (q+1));
	x = (double *) malloc(sizeof(double) * (p+1));
	f = (double *) malloc(sizeof(double) * (q+1));
	tau = (double *) malloc(sizeof(double) * (q+1));
	h = (double *) malloc(sizeof(double) * (q+1));
	T = (double *) malloc(sizeof(double) * (q+1) * (q+1));
	ipiv2 = (int *) malloc(sizeof(int) * (q+1));


	autocovar(inp,N,cv,K);
	for(i = 0; i < p+q+1;++i) {
		c[i] = cv[i*s];
	}

	x[0] = -1.0;

	for(i = 0; i < p;++i) {
		phi[i] = 0.0;
	}

	for(i = 0; i < q;++i) {
		theta[i] = 0.0;
	}

	//Step 1
	if (p > 0) {

		for(i = 1; i <= p;++i) {
			t = (i-1) * p;
			for(j = 1; j <= p;++j) {
				temp = q+i-j;
				if (temp < 0) {
					temp = -temp;
				}
				A[t+j-1] = c[temp];
			}
		}

		for(i = 0; i < p;++i) {
			b[i] = c[q+i+1];
		}

		ludecomp(A,p,ipiv);
		linsolve(A,p,b,ipiv,phi);

	}


	for(i = 0; i < p;++i) {
		x[i+1] = phi[i];
	}

	// Step 2
	if (p == 0) {
		for(i = 0; i < q + 1; ++i) {
			c2[i] = c[i];
		}
	} else {
		for(j = 0; j < q + 1;++j) {
			tempd = 0.0;
			for(i = 0; i < p + 1;++i) {
				for(l = 0; l < p + 1; ++l) {
					temp = j + i - l;
					if (temp < 0) {
						temp = -temp;
					}
					tempd += x[i]*x[l]*c[temp];
				}
			}
			c2[j] = tempd;
		}

	}

	//Step 3 Newton Raphson Method

	epsilon = 0.0001;

	for(i = 0; i <= q;++i) {
		tau[i] = 0.0;
		f[i] = 0.0;
	}
	tau[0] = sqrt(c2[0]);

	for(j = 0; j <= q;++j) {
		for(i = 0; i < q-j+1;++i) {
			f[j] += tau[i] * tau[i+j];
		}
		f[j] -= c2[j];
	}

	it1 = 0;

	while (array_max_abs(f,q+1) > epsilon && it1 < 200) {
		it1++;
		for(i = 0; i < q+1;++i) {
			t = i * (q+1);
			for(j = 0; j < q+1;++j) {
				tempd = 0.0;
				if (i + j <= q) {
					tempd=tempd+tau[i+j];
				}
				if (j - i >= 0 ) {
					tempd=tempd+tau[j-i];
				}
				T[t+j] = tempd;
			}
		}
		//mdisplay(T,q+1,q+1);
		ludecomp(T,q+1,ipiv2);
		linsolve(T,q+1,f,ipiv2,h);

		for(i = 0; i < q+1;++i) {
			tau[i] = tau[i] - h[i];
			f[i] = 0.0;
		}

		for(j = 0; j < q+1;++j) {
			for(i = 0; i < q-j+1;++i) {
				f[j]=f[j]+tau[i]*tau[i+j];
			}
			f[j] = f[j] - c2[j];
		}
	}

	for(j = 1; j < q+1;++j) {
		theta[j-1]=-1.0*tau[j]/tau[0];
	}


	free(c);
	free(cv);
	free(A);
	free(b);
	free(ipiv);
	free(c2);
	free(x);
	free(f);
	free(tau);
	free(T);
	free(ipiv2);
	free(h);

}